

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  Curl_easy *data;
  bool bVar4;
  byte bVar5;
  curl_socket_t readfd0;
  _Bool _Var6;
  anon_enum_32 aVar7;
  CURLcode CVar8;
  int iVar9;
  CHUNKcode CVar10;
  int iVar11;
  Curl_send_buffer *buff;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  time_t tVar15;
  ulong timeout_ms;
  undefined8 extraout_RAX;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  size_t len;
  CURLcode CVar22;
  char *pcVar23;
  char cVar24;
  char *local_98;
  long local_78;
  int subversion;
  curl_socket_t local_5c;
  ulong local_58;
  char *local_50;
  ssize_t gotbytes;
  long *local_40;
  ssize_t local_38;
  
  aVar7 = conn->tunnel_state[sockindex];
  local_50 = hostname;
  if (aVar7 == TUNNEL_INIT) {
    if (conn->connect_buffer != (char *)0x0) {
      aVar7 = TUNNEL_INIT;
      goto LAB_0012cddd;
    }
    pcVar12 = (char *)(*Curl_cmalloc)(0x4000);
    conn->connect_buffer = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    aVar7 = conn->tunnel_state[sockindex];
  }
  subversion = 0;
  if (aVar7 == TUNNEL_COMPLETE) {
LAB_0012cdae:
    CVar8 = CURLE_OK;
    if (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE) {
LAB_0012d7f0:
      (*Curl_cfree)(conn->connect_buffer);
      conn->connect_buffer = (char *)0x0;
    }
    return CVar8;
  }
LAB_0012cddd:
  subversion = 0;
  data = conn->data;
  local_5c = conn->sock[sockindex];
  (conn->bits).proxy_connect_closed = false;
  local_40 = &(data->info).request_size;
  piVar2 = &(data->req).httpcode;
  local_58 = 0;
  local_78 = 0;
LAB_0012ce25:
  pcVar12 = local_50;
  if (aVar7 != TUNNEL_INIT) {
LAB_0012d0ba:
    tVar15 = Curl_timeleft(data,(timeval *)0x0,true);
    if (0 < tVar15) goto code_r0x0012d0d2;
    pcVar12 = "Proxy CONNECT aborted due to timeout";
LAB_0012d7ac:
    Curl_failf(data,pcVar12);
LAB_0012d7b3:
    CVar8 = CURLE_RECV_ERROR;
    goto LAB_0012d7f0;
  }
  Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_50,(ulong)(uint)remote_port);
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  buff = Curl_add_buffer_init();
  CVar22 = CURLE_OUT_OF_MEMORY;
  CVar8 = CVar22;
  if (buff == (Curl_send_buffer *)0x0) goto LAB_0012d7f0;
  pcVar12 = curl_maprintf("%s:%hu",pcVar12,(ulong)(uint)remote_port);
  if (pcVar12 != (char *)0x0) {
    CVar8 = Curl_http_output_auth(conn,"CONNECT",pcVar12,true);
    (*Curl_cfree)(pcVar12);
    pcVar12 = local_50;
    if (CVar8 != CURLE_OK) {
      Curl_add_buffer_free(buff);
      goto LAB_0012d7f0;
    }
    pcVar20 = "1.1";
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
      pcVar20 = "1.0";
    }
    if ((conn->host).name == local_50) {
      cVar24 = (conn->bits).ipv6_ip;
    }
    else {
      pcVar13 = strchr(local_50,0x3a);
      cVar24 = pcVar13 != (char *)0x0;
    }
    pcVar13 = "";
    if (cVar24 != '\0') {
      pcVar13 = "[";
    }
    pcVar16 = "";
    if (cVar24 != '\0') {
      pcVar16 = "]";
    }
    pcVar12 = curl_maprintf("%s%s%s:%hu",pcVar13,pcVar12,pcVar16,(ulong)(uint)remote_port);
    CVar8 = CVar22;
    if (pcVar12 != (char *)0x0) {
      pcVar13 = Curl_checkProxyheaders(conn,"Host:");
      if (pcVar13 == (char *)0x0) {
        pcVar13 = curl_maprintf("Host: %s\r\n",pcVar12);
        if (pcVar13 == (char *)0x0) {
          (*Curl_cfree)(pcVar12);
          goto LAB_0012d930;
        }
      }
      else {
        pcVar13 = (char *)0x0;
      }
      pcVar16 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
      pcVar23 = "";
      if (pcVar16 == (char *)0x0) {
        pcVar23 = "Proxy-Connection: Keep-Alive\r\n";
      }
      pcVar14 = Curl_checkProxyheaders(conn,"User-Agent:");
      pcVar16 = "";
      if ((pcVar14 == (char *)0x0) && (pcVar16 = "", (data->set).str[0x24] != (char *)0x0)) {
        pcVar16 = (conn->allocptr).uagent;
      }
      pcVar14 = pcVar13;
      if (pcVar13 == (char *)0x0) {
        pcVar14 = "";
      }
      pcVar19 = (conn->allocptr).proxyuserpwd;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      CVar8 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar12,pcVar20,pcVar14,pcVar19
                               ,pcVar16,pcVar23);
      if (pcVar13 != (char *)0x0) {
        (*Curl_cfree)(pcVar13);
      }
      (*Curl_cfree)(pcVar12);
      if ((((CVar8 == CURLE_OK) &&
           (CVar8 = Curl_add_custom_headers(conn,true,buff), CVar8 == CURLE_OK)) &&
          (CVar8 = Curl_add_bufferf(buff,"\r\n"), CVar8 == CURLE_OK)) &&
         (CVar8 = Curl_add_buffer_send(buff,conn,local_40,0,sockindex), CVar8 == CURLE_OK)) {
        Curl_add_buffer_free((Curl_send_buffer *)0x0);
        conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
        goto LAB_0012d0ba;
      }
      Curl_failf(data,"Failed sending CONNECT to proxy");
      buff = (Curl_send_buffer *)0x0;
    }
  }
LAB_0012d930:
  Curl_add_buffer_free(buff);
  goto LAB_0012d7f0;
code_r0x0012d0d2:
  _Var6 = Curl_conn_data_pending(conn,sockindex);
  if (_Var6) {
    uVar17 = 0;
    bVar4 = false;
LAB_0012d0ea:
    do {
      bVar21 = bVar4;
      local_98 = conn->connect_buffer;
      uVar18 = 1;
      iVar11 = 0;
      pcVar12 = local_98;
LAB_0012d100:
      do {
        if ((0x3fff < uVar17) || (uVar18 == 0)) {
LAB_0012d69d:
          iVar11 = Curl_pgrsUpdate(conn);
          if (iVar11 != 0) {
LAB_0012d798:
            CVar8 = CURLE_ABORTED_BY_CALLBACK;
            goto LAB_0012d7f0;
          }
          if ((data->info).httpproxycode == 200) {
            pcVar12 = (data->req).newurl;
            if (!bVar21) goto LAB_0012d70e;
LAB_0012d865:
            if (pcVar12 != (char *)0x0) {
              Curl_closesocket(conn,conn->sock[sockindex]);
              conn->sock[sockindex] = -1;
            }
            bVar5 = 1;
          }
          else {
            CVar8 = Curl_http_auth_act(conn);
            if (CVar8 != CURLE_OK) goto LAB_0012d7f0;
            pcVar12 = (data->req).newurl;
            if (bVar21 || ((conn->bits).close & 1U) != 0) goto LAB_0012d865;
LAB_0012d70e:
            if (pcVar12 == (char *)0x0) {
              bVar5 = 0;
            }
            else {
              aVar7 = conn->tunnel_state[sockindex];
              if (aVar7 != TUNNEL_COMPLETE) goto LAB_0012ce25;
              conn->tunnel_state[sockindex] = TUNNEL_INIT;
              bVar5 = 0;
              Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
              if ((data->req).newurl != (char *)0x0) {
                aVar7 = conn->tunnel_state[sockindex];
                goto LAB_0012ce25;
              }
            }
          }
          if (*piVar2 == 200) {
            conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            (*Curl_cfree)((conn->allocptr).proxyuserpwd);
            (conn->allocptr).proxyuserpwd = (char *)0x0;
            (data->state).authproxy.done = true;
            Curl_infof(data,"Proxy replied OK to CONNECT request\n");
            (data->req).ignorebody = false;
            (conn->bits).rewindaftersend = false;
            goto LAB_0012cdae;
          }
          pcVar12 = (data->req).newurl;
          if ((bool)(bVar5 & pcVar12 != (char *)0x0)) {
            (conn->bits).proxy_connect_closed = true;
            Curl_infof(data,"Connect me again please\n");
          }
          else {
            (*Curl_cfree)(pcVar12);
            (data->req).newurl = (char *)0x0;
            Curl_conncontrol(conn,2);
            Curl_closesocket(conn,conn->sock[sockindex]);
            conn->sock[sockindex] = -1;
          }
          conn->tunnel_state[sockindex] = TUNNEL_INIT;
          if ((conn->bits).proxy_connect_closed == true) {
            return CURLE_OK;
          }
          Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                     (ulong)(uint)(data->req).httpcode);
          goto LAB_0012d7b3;
        }
        uVar17 = uVar17 + 1;
LAB_0012d126:
        while( true ) {
          iVar9 = Curl_pgrsUpdate(conn);
          if (iVar9 != 0) goto LAB_0012d798;
          if (conn->connect_buffer + 0x4000 <= pcVar12) {
            pcVar12 = "CONNECT response too large!";
            goto LAB_0012d7ac;
          }
          timeout_ms = Curl_timeleft(data,(timeval *)0x0,true);
          readfd0 = local_5c;
          if ((long)timeout_ms < 1) {
            pcVar12 = "Proxy CONNECT aborted due to timeout";
            goto LAB_0012d7d0;
          }
          CVar8 = Curl_read(conn,local_5c,pcVar12,1,&gotbytes);
          if (CVar8 == CURLE_AGAIN) goto code_r0x0012d18d;
          if (CVar8 != CURLE_OK) goto LAB_0012d69d;
          if (gotbytes < 1) {
            if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
              pcVar12 = "Proxy CONNECT aborted";
              goto LAB_0012d7d0;
            }
            (conn->bits).proxy_connect_closed = true;
            Curl_infof(data,"Proxy CONNECT connection closed\n");
            goto LAB_0012d69d;
          }
          if (uVar18 < 2) break;
          pcVar12 = conn->connect_buffer;
          if (local_78 == 0) {
            local_38 = 0;
            CVar10 = Curl_httpchunk_read(conn,pcVar12,1,&local_38);
            uVar18 = 2;
            if (CVar10 == CHUNKE_STOP) {
              uVar18 = 0;
              Curl_infof(data,"chunk reading DONE\n");
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            }
            local_78 = 0;
          }
          else {
            lVar1 = local_78 + -1;
            uVar18 = 2;
            bVar4 = local_78 < 2;
            local_78 = lVar1;
            if (bVar4) goto LAB_0012d69d;
          }
          uVar17 = 1;
          if (uVar18 == 0) goto LAB_0012d69d;
        }
        iVar11 = iVar11 + 1;
        cVar24 = *pcVar12;
        pcVar12 = pcVar12 + 1;
        uVar18 = 1;
      } while (cVar24 != '\n');
      if ((data->set).verbose == true) {
        Curl_debug(data,CURLINFO_HEADER_IN,local_98,(long)iVar11,conn);
      }
      len = (size_t)iVar11;
      if (((data->set).suppress_connect_headers != true) &&
         (CVar8 = Curl_client_write(conn,(data->set).include_header | 2,local_98,len),
         CVar8 != CURLE_OK)) goto LAB_0012d7f0;
      plVar3 = &(data->info).header_size;
      *plVar3 = *plVar3 + len;
      plVar3 = &(data->req).headerbytecount;
      *plVar3 = *plVar3 + len;
      if ((*local_98 == '\r') || (*local_98 == '\n')) {
        pcVar12 = conn->connect_buffer;
        uVar18 = 0;
        if ((*piVar2 == 0x197) && ((data->state).authproblem == false)) {
          if (local_78 == 0) {
            if ((local_58 & 1) != 0) {
              Curl_infof(data,"Ignore chunked response-body\n");
              (data->req).ignorebody = true;
              if (local_98[1] == '\n') {
                local_98 = local_98 + 1;
              }
              CVar10 = Curl_httpchunk_read(conn,local_98 + 1,1,&gotbytes);
              uVar18 = 2;
              if (CVar10 == CHUNKE_STOP) {
                uVar18 = 0;
                Curl_infof(data,"chunk reading DONE\n");
              }
            }
          }
          else {
            Curl_infof(data,"Ignore %ld bytes of response-body\n",local_78);
            uVar18 = 2;
          }
        }
        conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
        uVar17 = 0;
        goto LAB_0012d100;
      }
      local_98[len] = '\0';
      iVar11 = curl_strnequal("WWW-Authenticate:",local_98,0x11);
      bVar4 = bVar21;
      if ((iVar11 != 0) && (*piVar2 == 0x191)) {
        _Var6 = false;
LAB_0012d45e:
        pcVar12 = Curl_copy_header_value(local_98);
        if (pcVar12 == (char *)0x0) {
          CVar8 = CURLE_OUT_OF_MEMORY;
          goto LAB_0012d7f0;
        }
        CVar8 = Curl_http_input_auth(conn,_Var6,pcVar12);
        (*Curl_cfree)(pcVar12);
        if (CVar8 != CURLE_OK) goto LAB_0012d7f0;
        goto LAB_0012d0ea;
      }
      iVar11 = curl_strnequal("Proxy-authenticate:",local_98,0x13);
      if ((iVar11 != 0) && (_Var6 = true, *piVar2 == 0x197)) goto LAB_0012d45e;
      iVar11 = curl_strnequal("Content-Length:",local_98,0xf);
      if (iVar11 == 0) goto LAB_0012d4f9;
      if (*piVar2 - 200U < 100) {
        pcVar12 = "Ignoring Content-Length in CONNECT %03d response\n";
        goto LAB_0012d4ed;
      }
      local_78 = strtol(local_98 + 0xf,(char **)0x0,10);
    } while( true );
  }
  goto LAB_0012cdae;
code_r0x0012d18d:
  if (999 < timeout_ms) {
    timeout_ms = 1000;
  }
  iVar9 = Curl_socket_check(readfd0,-1,-1,timeout_ms);
  if (iVar9 == -1) {
    pcVar12 = "Proxy CONNECT aborted due to select/poll error";
LAB_0012d7d0:
    Curl_failf(data,pcVar12);
    iVar11 = Curl_pgrsUpdate(conn);
    CVar8 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar11 == 0) {
      CVar8 = CURLE_RECV_ERROR;
    }
    goto LAB_0012d7f0;
  }
  goto LAB_0012d126;
LAB_0012d4f9:
  _Var6 = Curl_compareheader(local_98,"Connection:","close");
  bVar4 = true;
  if (!_Var6) {
    iVar11 = curl_strnequal("Transfer-Encoding:",local_98,0x12);
    if (iVar11 == 0) {
      _Var6 = Curl_compareheader(local_98,"Proxy-Connection:","close");
      if ((!_Var6) &&
         (iVar11 = __isoc99_sscanf(local_98,"HTTP/1.%d %d",&subversion,piVar2), bVar4 = bVar21,
         iVar11 == 2)) {
        (data->info).httpproxycode = (data->req).httpcode;
      }
    }
    else if (*piVar2 - 200U < 100) {
      pcVar12 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
LAB_0012d4ed:
      Curl_infof(data,pcVar12);
      bVar4 = bVar21;
    }
    else {
      _Var6 = Curl_compareheader(local_98,"Transfer-Encoding:","chunked");
      bVar4 = bVar21;
      if (_Var6) {
        Curl_infof(data,"CONNECT responded chunked\n");
        Curl_httpchunk_init(conn);
        local_58 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
    }
  }
  goto LAB_0012d0ea;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
    if(!conn->connect_buffer) {
      conn->connect_buffer = malloc(CONNECT_BUFFER_SIZE);
      if(!conn->connect_buffer)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || (TUNNEL_COMPLETE == conn->tunnel_state[sockindex]))
    Curl_safefree(conn->connect_buffer);

  return result;
}